

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  istream *piVar5;
  size_type sVar6;
  reference pvVar7;
  GLFWwindow *handle;
  ostream *poVar8;
  GLFWmonitor *handle_00;
  GLFWwindow *window;
  string local_498 [8];
  string token;
  stringstream local_478 [8];
  stringstream ss;
  undefined1 local_2f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_cmds;
  string cmd;
  int local_2b4;
  string local_2b0 [4];
  int i_1;
  string line;
  undefined1 local_290 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text;
  vec3 cl;
  vec3 l;
  long local_250;
  ifstream input_stream;
  int local_48;
  float local_44;
  int i;
  vec3 zero;
  char buffer [32];
  char **argv_local;
  int argc_local;
  
  printf("Enter Options File (max 32 chars): ");
  __isoc99_scanf(" %32s",zero + 1);
  printf("Initialzed using option file [%s]\n");
  memset(&local_44,0,0xc);
  for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
    change_light(dls,dl_cs,0,&local_44,&local_44);
    change_light(pls,pl_cs,0,&local_44,&local_44);
  }
  std::ifstream::ifstream(&local_250,(char *)(zero + 1),_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_250 + *(long *)(local_250 + -0x18)));
  if ((bVar1 & 1) != 0) {
    printf("Can\'t open the option file, using default.");
    cl[1] = 1.0;
    cl[2] = 1.0;
    stack0xfffffffffffffd8c = 0x3f4ccccd3f4ccccd;
    cl[0] = 0.8;
    change_light(dls,dl_cs,0,cl + 1,
                 (float *)((long)&text.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_290);
  std::__cxx11::string::string(local_2b0);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_250,local_2b0);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_290,(value_type *)local_2b0);
  }
  std::ifstream::close();
  for (local_2b4 = 0;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_290), (ulong)(long)local_2b4 < sVar6; local_2b4 = local_2b4 + 1) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_290,(long)local_2b4);
    std::__cxx11::string::string
              ((string *)
               &split_cmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2f0);
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              (local_478,
               (string *)
               &split_cmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,_Var3);
    std::__cxx11::string::string(local_498);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_478,local_498,' ');
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f0,(value_type *)local_498);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&window,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2f0);
    read_cmd_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&window);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&window);
    std::__cxx11::string::~string(local_498);
    std::__cxx11::stringstream::~stringstream(local_478);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2f0);
    std::__cxx11::string::~string
              ((string *)
               &split_cmds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  initializeRendering();
  handle = glfwCreateWindow(Width_global,Height_global,"Computer Graphics",(GLFWmonitor *)0x0,
                            (GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error on window creating");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    glfwTerminate();
    argv_local._4_4_ = -1;
  }
  else {
    handle_00 = glfwGetPrimaryMonitor();
    VideoMode_global = glfwGetVideoMode(handle_00);
    if (VideoMode_global == (GLFWvidmode *)0x0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error on getting monitor");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      glfwTerminate();
      argv_local._4_4_ = -1;
    }
    else {
      glfwMakeContextCurrent(handle);
      size_callback(handle,0,0);
      glfwSetWindowSizeCallback(handle,size_callback);
      glfwSetKeyCallback(handle,key_callback);
      while (iVar4 = glfwWindowShouldClose(handle), iVar4 == 0) {
        display(handle);
        glfwPollEvents();
      }
      argv_local._4_4_ = 0;
    }
  }
  std::__cxx11::string::~string(local_2b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_290);
  std::ifstream::~ifstream(&local_250);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {

    //take user input
    char buffer[32];
    printf("Enter Options File (max 32 chars): ");
    scanf(" %32s", buffer);
    printf("Initialzed using option file [%s]\n", buffer);

    //initialize lights
    vec3 zero = {0.0f, 0.0f, 0.0f};
    for(int i=0; i<5; i++){
        change_light(dls, dl_cs, 0, zero, zero);
        change_light(pls, pl_cs, 0, zero, zero);
    }

    //open option file and record variables
    ifstream input_stream(buffer);
    if(!input_stream){
        printf("Can't open the option file, using default.");
        //add a default directional light
        vec3 l = {1.0f, 1.0f, 0.8f};
        vec3 cl = {0.8f, 0.8f, 0.8f};
        change_light(dls, dl_cs, 0, l, cl);
    }
    
    //read lines for values
    vector<string> text;
    string line;
    while(getline(input_stream, line)) text.push_back(line);
    input_stream.close();
    for(int i=0; i<text.size();i++){
        string cmd = text[i];
        vector<string> split_cmds;
        stringstream ss(cmd);
        string token;
        while(getline(ss, token, ' ')) split_cmds.push_back(token);
        read_cmd_tokens(split_cmds);
    }

    //This initializes glfw
    initializeRendering();
    
    GLFWwindow* window = glfwCreateWindow( Width_global, Height_global, "Computer Graphics", NULL, NULL );
    if ( !window )
    {
        cerr << "Error on window creating" << endl;
        glfwTerminate();
        return -1;
    }
    
    VideoMode_global = glfwGetVideoMode(glfwGetPrimaryMonitor());
    if ( !VideoMode_global )
    {
        cerr << "Error on getting monitor" << endl;
        glfwTerminate();
        return -1;
    }
    
    glfwMakeContextCurrent( window );

    size_callback(window, 0, 0);
    
    glfwSetWindowSizeCallback(window, size_callback);
    glfwSetKeyCallback(window, key_callback);
                
    while( !glfwWindowShouldClose( window ) ) // main loop to draw object again and again
    {
        display( window );

        glfwPollEvents();        
    }

    return 0;
}